

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O2

HighsInt __thiscall
HighsOrbitopeMatrix::orbitalFixingForFullOrbitope
          (HighsOrbitopeMatrix *this,vector<int,_std::allocator<int>_> *rows,HighsDomain *domain)

{
  anon_class_1_0_00000001 *this_00;
  int8_t *colj1;
  double *pdVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  vector<int,_std::allocator<int>_> *pvVar5;
  byte bVar6;
  HighsInt j;
  int iVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  anon_class_1_0_00000001 aVar11;
  HighsInt HVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  pointer pcVar16;
  uint uVar17;
  ulong uVar18;
  double dVar19;
  HighsDomainChange boundchg;
  HighsInt numDynamicRows;
  ulong local_88;
  vector<int,_std::allocator<int>_> *local_80;
  pointer local_78;
  anon_class_1_0_00000001 *local_70;
  anon_class_8_1_d8bc2d90 i_fixed;
  vector<signed_char,_std::allocator<signed_char>_> Mminimal;
  vector<signed_char,_std::allocator<signed_char>_> Mmaximal;
  
  uVar18 = (ulong)((long)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start) >> 2;
  numDynamicRows = (HighsInt)uVar18;
  Mmaximal.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0xff;
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            (&Mminimal,(long)numDynamicRows * (long)this->rowLength,(value_type *)&Mmaximal,
             (allocator_type *)&i_fixed);
  for (iVar7 = 0; iVar7 < this->rowLength; iVar7 = iVar7 + 1) {
    for (lVar14 = 0; iVar13 = (int)uVar18, lVar14 < iVar13; lVar14 = lVar14 + 1) {
      iVar3 = (this->matrix).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start
              [(long)this->numRows * (long)iVar7 +
               (long)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar14]];
      dVar19 = (domain->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar3];
      if ((dVar19 != 1.0) || (NAN(dVar19))) {
        dVar19 = (domain->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar3];
        if ((dVar19 == 0.0) && (!NAN(dVar19))) {
          Mminimal.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start[iVar13 * iVar7 + (int)lVar14] = '\0';
        }
      }
      else {
        Mminimal.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start[iVar13 * iVar7 + (int)lVar14] = '\x01';
      }
      uVar18 = (ulong)(uint)numDynamicRows;
    }
  }
  std::vector<signed_char,_std::allocator<signed_char>_>::vector(&Mmaximal,&Mminimal);
  iVar7 = (this->rowLength + -1) * numDynamicRows;
  for (lVar14 = 0; uVar18 = (ulong)(uint)numDynamicRows, lVar14 < numDynamicRows;
      lVar14 = lVar14 + 1) {
    if (Mminimal.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start[lVar14 + iVar7] == -1) {
      Mminimal.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar14 + iVar7] = '\0';
    }
    if (*(char *)(CONCAT71(Mmaximal.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,
                           Mmaximal.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                           _M_impl.super__Vector_impl_data._M_start._0_1_) + lVar14) == -1) {
      *(undefined1 *)
       (CONCAT71(Mmaximal.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_start._1_7_,
                 Mmaximal.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_start._0_1_) + lVar14) = 1;
    }
  }
  i_fixed.numDynamicRows = &numDynamicRows;
  HVar12 = this->rowLength + -2;
  local_80 = rows;
  while (pcVar16 = Mminimal.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                   super__Vector_impl_data._M_start, -1 < HVar12) {
    uVar17 = (uint)uVar18;
    local_78 = (pointer)CONCAT44(local_78._4_4_,HVar12);
    local_88 = (ulong)(int)(uVar17 * HVar12);
    this_00 = (anon_class_1_0_00000001 *)
              (Mminimal.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start + local_88);
    lVar14 = (long)(int)uVar17;
    local_70 = this_00 + lVar14;
    uVar8 = orbitalFixingForFullOrbitope::anon_class_8_1_d8bc2d90::operator()
                      (&i_fixed,(int8_t *)this_00,(int8_t *)local_70);
    uVar4 = local_88;
    if (uVar8 == uVar17) {
      for (lVar9 = 0; lVar9 < (int)uVar18; lVar9 = lVar9 + 1) {
        aVar11 = this_00[lVar9];
        this_00[lVar9] =
             (anon_class_1_0_00000001)
             ((aVar11 == (anon_class_1_0_00000001)0xff & pcVar16[lVar9 + lVar14 + local_88]) +
             (char)aVar11 + (aVar11 == (anon_class_1_0_00000001)0xff));
        uVar18 = (ulong)(uint)numDynamicRows;
      }
    }
    else {
      uVar8 = orbitalFixingForFullOrbitope::anon_class_1_0_00000001::operator()
                        (this_00,(int8_t *)local_70,(int8_t *)(ulong)uVar8,HVar12);
      if (uVar8 == 0xffffffff) goto LAB_002f5d3d;
      uVar18 = 0;
      if (0 < (int)uVar8) {
        uVar18 = (ulong)uVar8;
      }
      for (uVar15 = 0; uVar18 != uVar15; uVar15 = uVar15 + 1) {
        aVar11 = this_00[uVar15];
        this_00[uVar15] =
             (anon_class_1_0_00000001)
             ((aVar11 == (anon_class_1_0_00000001)0xff & pcVar16[uVar15 + lVar14 + uVar4]) +
             (char)aVar11 + (aVar11 == (anon_class_1_0_00000001)0xff));
      }
      lVar14 = (long)(int)uVar8;
      this_00[lVar14] = (anon_class_1_0_00000001)0x1;
      while( true ) {
        lVar14 = lVar14 + 1;
        uVar18 = (ulong)numDynamicRows;
        if ((long)uVar18 <= lVar14) break;
        aVar11 = this_00[lVar14];
        if (aVar11 == (anon_class_1_0_00000001)0xff) {
          aVar11 = (anon_class_1_0_00000001)0x0;
        }
        this_00[lVar14] = aVar11;
      }
    }
    HVar12 = (int)local_78 + -1;
  }
  iVar7 = 1;
  while (pvVar5 = local_80, iVar7 < this->rowLength) {
    lVar14 = CONCAT71(Mmaximal.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                      .super__Vector_impl_data._M_start._1_7_,
                      Mmaximal.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                      .super__Vector_impl_data._M_start._0_1_);
    uVar17 = (uint)uVar18;
    local_78 = (pointer)CONCAT44(local_78._4_4_,iVar7);
    local_88 = (ulong)(int)(uVar17 * iVar7);
    colj1 = (int8_t *)(local_88 + lVar14);
    lVar9 = (long)(int)uVar17;
    local_70 = (anon_class_1_0_00000001 *)(colj1 + -lVar9);
    uVar8 = orbitalFixingForFullOrbitope::anon_class_8_1_d8bc2d90::operator()
                      (&i_fixed,(int8_t *)local_70,colj1);
    uVar4 = local_88;
    if (uVar8 == uVar17) {
      for (lVar10 = 0; lVar10 < (int)uVar18; lVar10 = lVar10 + 1) {
        cVar2 = colj1[lVar10];
        colj1[lVar10] =
             (cVar2 == -1 & *(byte *)(lVar14 + (local_88 - lVar9) + lVar10)) + cVar2 + (cVar2 == -1)
        ;
        uVar18 = (ulong)(uint)numDynamicRows;
      }
    }
    else {
      uVar8 = orbitalFixingForFullOrbitope::anon_class_1_0_00000001::operator()
                        (local_70,colj1,(int8_t *)(ulong)uVar8,iVar7);
      if (uVar8 == 0xffffffff) goto LAB_002f5d3d;
      uVar18 = 0;
      if (0 < (int)uVar8) {
        uVar18 = (ulong)uVar8;
      }
      for (uVar15 = 0; uVar18 != uVar15; uVar15 = uVar15 + 1) {
        cVar2 = colj1[uVar15];
        colj1[uVar15] =
             (cVar2 == -1 & *(byte *)(lVar14 + (uVar4 - lVar9) + uVar15)) + cVar2 + (cVar2 == -1);
      }
      lVar14 = (long)(int)uVar8;
      colj1[lVar14] = '\0';
      while( true ) {
        lVar14 = lVar14 + 1;
        uVar18 = (ulong)numDynamicRows;
        if ((long)uVar18 <= lVar14) break;
        colj1[lVar14] = (colj1[lVar14] == -1) * '\x02' + colj1[lVar14];
      }
    }
    iVar7 = (int)local_78 + 1;
  }
  local_88 = 0;
  iVar7 = 0;
  do {
    if (this->rowLength <= iVar7) {
      bVar6 = domain->infeasible_;
      goto LAB_002f5e65;
    }
    iVar13 = numDynamicRows * iVar7;
    lVar14 = CONCAT71(Mmaximal.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                      .super__Vector_impl_data._M_start._1_7_,
                      Mmaximal.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                      .super__Vector_impl_data._M_start._0_1_);
    pcVar16 = Mminimal.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_start + iVar13;
    local_80 = (vector<int,_std::allocator<int>_> *)CONCAT44(local_80._4_4_,iVar7);
    HVar12 = numDynamicRows;
    local_78 = pcVar16;
    for (lVar9 = 0;
        (lVar9 < HVar12 && (cVar2 = pcVar16[lVar9], cVar2 == *(char *)(lVar14 + iVar13 + lVar9)));
        lVar9 = lVar9 + 1) {
      uVar8 = (this->matrix).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start
              [(long)this->numRows * (long)iVar7 +
               (long)(pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar9]];
      dVar19 = (domain->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[(int)uVar8];
      pdVar1 = (domain->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + (int)uVar8;
      if ((dVar19 != *pdVar1) || (NAN(dVar19) || NAN(*pdVar1))) {
        local_88 = (ulong)((int)local_88 + 1);
        dVar19 = 1.0;
        if (cVar2 != '\x01') {
          dVar19 = 0.0;
        }
        uVar18 = (ulong)uVar8 + 0x100000000;
        if (cVar2 == '\x01') {
          uVar18 = (ulong)uVar8;
        }
        boundchg.column = (int)uVar18;
        boundchg.boundtype = (int)(uVar18 >> 0x20);
        boundchg.boundval = dVar19;
        HighsDomain::changeBound(domain,boundchg,(Reason)0xfffffffe);
        pcVar16 = local_78;
        HVar12 = numDynamicRows;
        if (domain->infeasible_ != false) break;
      }
    }
    iVar7 = (int)local_80 + 1;
  } while (domain->infeasible_ != true);
  bVar6 = 1;
LAB_002f5e65:
  if ((bVar6 & 1) == 0) {
    HighsDomain::propagate(domain);
    HVar12 = (HighsInt)local_88;
  }
  else {
    HVar12 = (HighsInt)local_88;
  }
LAB_002f5e7d:
  std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
            (&Mmaximal.super__Vector_base<signed_char,_std::allocator<signed_char>_>);
  std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
            (&Mminimal.super__Vector_base<signed_char,_std::allocator<signed_char>_>);
  return HVar12;
LAB_002f5d3d:
  domain->infeasible_ = true;
  domain->infeasible_pos =
       (HighsInt)
       ((ulong)((long)(domain->domchgstack_).
                      super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(domain->domchgstack_).
                     super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                     _M_impl.super__Vector_impl_data._M_start) >> 4);
  (domain->infeasible_reason).type = -2;
  (domain->infeasible_reason).index = 0;
  HVar12 = 0;
  goto LAB_002f5e7d;
}

Assistant:

HighsInt HighsOrbitopeMatrix::orbitalFixingForFullOrbitope(
    const std::vector<HighsInt>& rows, HighsDomain& domain) const {
  HighsInt numDynamicRows = rows.size();
  std::vector<int8_t> Mminimal(numDynamicRows * rowLength, -1);

  for (HighsInt j = 0; j < rowLength; ++j) {
    for (HighsInt i = 0; i < numDynamicRows; ++i) {
      HighsInt r = rows[i];
      HighsInt colij = matrix[r + j * numRows];
      if (domain.col_lower_[colij] == 1.0)
        Mminimal[i + j * numDynamicRows] = 1;
      else if (domain.col_upper_[colij] == 0.0)
        Mminimal[i + j * numDynamicRows] = 0;
    }
  }

  std::vector<int8_t> Mmaximal = Mminimal;

  int8_t* MminimaljLast = Mminimal.data() + numDynamicRows * (rowLength - 1);
  int8_t* MmaximaljFirst = Mmaximal.data();
  for (HighsInt k = 0; k < numDynamicRows; ++k) {
    if (MminimaljLast[k] == -1) MminimaljLast[k] = 0;
    if (MmaximaljFirst[k] == -1) MmaximaljFirst[k] = 1;
  }

  auto i_fixed = [&](const int8_t* colj0, const int8_t* colj1) {
    for (HighsInt i = 0; i < numDynamicRows; ++i) {
      if (colj0[i] != -1 && colj1[i] != -1 && colj0[i] != colj1[i]) return i;
    }

    return numDynamicRows;
  };

  auto i_discr = [&](const int8_t* colj0, const int8_t* colj1, HighsInt i_f) {
    for (HighsInt i = i_f; i >= 0; --i) {
      if (colj0[i] != 0 && colj1[i] != 1) return i;
    }

    return HighsInt{-1};
  };

  for (HighsInt j = rowLength - 2; j >= 0; --j) {
    int8_t* colj0 = Mminimal.data() + j * numDynamicRows;
    int8_t* colj1 = colj0 + numDynamicRows;
    HighsInt i_f = i_fixed(colj0, colj1);

    if (i_f == numDynamicRows) {
      for (HighsInt k = 0; k < numDynamicRows; ++k) {
        int8_t isFree = (colj0[k] == -1);
        colj0[k] += (isFree & colj1[k]) + isFree;
      }
    } else {
      HighsInt i_d = i_discr(colj0, colj1, i_f);
      if (i_d == -1) {
        domain.markInfeasible();
        return 0;
      }

      for (HighsInt k = 0; k < i_d; ++k) {
        int8_t isFree = (colj0[k] == -1);
        colj0[k] += (isFree & colj1[k]) + isFree;
      }
      colj0[i_d] = 1;
      for (HighsInt k = i_d + 1; k < numDynamicRows; ++k)
        colj0[k] += (colj0[k] == -1);
    }
  }

  for (HighsInt j = 1; j < rowLength; ++j) {
    int8_t* colj0 = Mmaximal.data() + j * numDynamicRows;
    int8_t* colj1 = colj0 - numDynamicRows;
    HighsInt i_f = i_fixed(colj1, colj0);

    if (i_f == numDynamicRows) {
      for (HighsInt k = 0; k < numDynamicRows; ++k) {
        int8_t isFree = (colj0[k] == -1);
        colj0[k] += (isFree & colj1[k]) + isFree;
      }
    } else {
      HighsInt i_d = i_discr(colj1, colj0, i_f);
      if (i_d == -1) {
        domain.markInfeasible();
        return 0;
      }
      for (HighsInt k = 0; k < i_d; ++k) {
        int8_t isFree = (colj0[k] == -1);
        colj0[k] += (isFree & colj1[k]) + isFree;
      }
      colj0[i_d] = 0;
      for (HighsInt k = i_d + 1; k < numDynamicRows; ++k)
        colj0[k] += 2 * (colj0[k] == -1);
    }
  }

  HighsInt numFixed = 0;

  for (HighsInt j = 0; j < rowLength; ++j) {
    const int8_t* colMaximal = Mmaximal.data() + j * numDynamicRows;
    const int8_t* colMinimal = Mminimal.data() + j * numDynamicRows;

    for (HighsInt i = 0; i < numDynamicRows; ++i) {
      if (colMinimal[i] != colMaximal[i]) {
        assert(colMinimal[i] < colMaximal[i]);
        break;
      }

      HighsInt r = rows[i];
      HighsInt colrj = matrix[r + j * numRows];
      if (domain.isFixed(colrj)) continue;

      ++numFixed;
      if (colMinimal[i] == 1)
        domain.changeBound(HighsBoundType::kLower, colrj, 1.0,
                           HighsDomain::Reason::unspecified());
      else
        domain.changeBound(HighsBoundType::kUpper, colrj, 0.0,
                           HighsDomain::Reason::unspecified());
      if (domain.infeasible()) break;
    }
    if (domain.infeasible()) break;
  }

  if (!domain.infeasible()) domain.propagate();

  return numFixed;
}